

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_part.c
# Opt level: O1

int cmime_part_from_file(CMimePart_T **part,char *filename,char *nl)

{
  CMimePart_T **ppCVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  CMimeInfo_T *mi;
  char *pcVar5;
  FILE *__stream;
  size_t sVar6;
  long lVar7;
  CMimePart_T **ppCVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  undefined1 local_100 [8];
  stat fileinfo;
  uchar local_64 [4];
  CMimePart_T **ppCStack_60;
  uchar out [4];
  char *local_50;
  char *ptemp;
  ulong local_40;
  uchar local_33 [8];
  uchar in [3];
  
  local_50 = (char *)0x0;
  ppCStack_60 = part;
  if (*part == (CMimePart_T *)0x0) {
    __assert_fail("(*part)",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_part.c"
                  ,0xea,"int cmime_part_from_file(CMimePart_T **, char *, const char *)");
  }
  if (filename != (char *)0x0) {
    iVar2 = stat(filename,(stat *)local_100);
    iVar3 = -1;
    if ((iVar2 == 0) && (iVar3 = -2, ((uint)fileinfo.st_nlink & 0xf000) == 0x8000)) {
      if (nl == (char *)0x0) {
        nl = _cmime_internal_determine_linebreak_from_file(filename);
      }
      ptemp = nl;
      mi = cmime_util_info_get_from_file(filename);
      pcVar10 = mi->mime_encoding;
      iVar2 = strcmp(pcVar10,"binary");
      ppCVar8 = ppCStack_60;
      pcVar5 = mi->mime_type;
      if (iVar2 == 0) {
        pcVar10 = __xpg_basename(filename);
        pcVar9 = "%s;%s\tname=%s%s";
      }
      else {
        pcVar9 = "%s;%s\tcharset=%s%s";
      }
      asprintf(&local_50,pcVar9,pcVar5,ptemp,pcVar10,ptemp);
      cmime_util_info_free(mi);
      cmime_part_set_content_type(*ppCVar8,local_50);
      pcVar10 = local_50;
      iVar2 = strncmp(local_50,"text/plain",10);
      if (iVar2 == 0) {
        pcVar5 = strstr(pcVar10,"ascii");
        free(pcVar10);
        pcVar10 = "7bit%s";
        if (pcVar5 == (char *)0x0) {
          pcVar10 = "8bit%s";
        }
      }
      else {
        free(pcVar10);
        pcVar10 = "base64%s";
      }
      pcVar5 = ptemp;
      asprintf(&local_50,pcVar10,ptemp);
      cmime_part_set_content_transfer_encoding(*ppCVar8,local_50);
      free(local_50);
      pcVar10 = __xpg_basename(filename);
      asprintf(&local_50,"attachment;%s\tfilename=%s%s",pcVar5,pcVar10,pcVar5);
      cmime_part_set_content_disposition(*ppCVar8,local_50);
      free(local_50);
      __stream = fopen(filename,"rb");
      if (__stream == (FILE *)0x0) {
        iVar3 = -3;
        pcVar10 = "libcmime: error opening file";
      }
      else {
        pcVar10 = (char *)calloc(1,1);
        (*ppCVar8)->content = pcVar10;
        iVar3 = feof(__stream);
        if (iVar3 == 0) {
          uVar12 = 0;
          iVar3 = 0;
          do {
            local_40 = CONCAT44(local_40._4_4_,iVar3);
            lVar11 = 0;
            iVar3 = 0;
            do {
              iVar4 = fgetc(__stream);
              local_33[lVar11] = (uchar)iVar4;
              iVar4 = feof(__stream);
              if (iVar4 == 0) {
                iVar3 = iVar3 + 1;
              }
              else {
                local_33[lVar11] = '\0';
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 != 3);
            if (iVar3 == 0) {
              iVar3 = (int)local_40;
            }
            else {
              lVar11 = (long)(int)uVar12;
              if (iVar2 == 0) {
                pcVar10 = (*ppCVar8)->content;
                sVar6 = strlen(pcVar10);
                pcVar10 = (char *)realloc(pcVar10,sVar6 + 5);
                (*ppCVar8)->content = pcVar10;
                lVar7 = 0;
                do {
                  (*ppCVar8)->content[lVar7 + lVar11] = local_33[lVar7];
                  lVar7 = lVar7 + 1;
                } while (lVar7 != 3);
              }
              else {
                cmime_base64_encode_block(local_33,local_64,iVar3);
                pcVar10 = (*ppCVar8)->content;
                sVar6 = strlen(pcVar10);
                pcVar10 = (char *)realloc(pcVar10,sVar6 + 6);
                (*ppCVar8)->content = pcVar10;
                lVar7 = 0;
                do {
                  (*ppCVar8)->content[lVar7 + lVar11] = local_64[lVar7];
                  lVar7 = lVar7 + 1;
                } while (lVar7 != 4);
                lVar7 = 4;
              }
              uVar12 = lVar11 + lVar7;
              (*ppCVar8)->content[(int)uVar12] = '\0';
              iVar3 = (int)local_40 + 1;
            }
            if (((0x11 < iVar3) || (iVar4 = feof(__stream), iVar4 != 0)) &&
               (bVar13 = iVar3 != 0, iVar3 = 0, bVar13 && iVar2 != 0)) {
              pcVar10 = (*ppCVar8)->content;
              local_40 = uVar12;
              fileinfo.__glibc_reserved[2] = strlen(pcVar10);
              pcVar5 = ptemp;
              sVar6 = strlen(ptemp);
              pcVar9 = (char *)realloc(pcVar10,fileinfo.__glibc_reserved[2] + sVar6 + 1);
              pcVar10 = ptemp;
              ppCVar1 = ppCStack_60;
              (*ppCVar8)->content = pcVar9;
              uVar12 = local_40;
              if (*pcVar5 != '\0') {
                lVar11 = (long)(int)local_40;
                uVar12 = 0;
                do {
                  (*ppCVar1)->content[uVar12 + lVar11] = pcVar10[uVar12];
                  uVar12 = uVar12 + 1;
                  sVar6 = strlen(pcVar10);
                } while (uVar12 < sVar6);
                uVar12 = (ulong)(uint)((int)local_40 + (int)uVar12);
              }
              iVar3 = 0;
              (*ppCStack_60)->content[(int)uVar12] = '\0';
              ppCVar8 = ppCStack_60;
            }
            iVar4 = feof(__stream);
          } while (iVar4 == 0);
        }
        iVar2 = fclose(__stream);
        iVar3 = 0;
        if (iVar2 == 0) {
          return 0;
        }
        pcVar10 = "libcmime: error closing file";
      }
      perror(pcVar10);
    }
    return iVar3;
  }
  __assert_fail("filename",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_part.c"
                ,0xeb,"int cmime_part_from_file(CMimePart_T **, char *, const char *)");
}

Assistant:

int cmime_part_from_file(CMimePart_T **part, char *filename, const char *nl) {
    struct stat fileinfo;
    int retval = 0;
    FILE *fp = NULL;
    int encode = 0;
    int i = 0;
    int len = 0;
    int blocksout = 0;
    int pos = 0;
    unsigned char in[3], out[4];
    char *ptemp = NULL;
    CMimeInfo_T *mi = NULL;

    assert((*part));
    assert(filename);

    /* only regular files please */
    retval = stat(filename,&fileinfo);
    if (retval == 0) {
        if(S_ISREG(fileinfo.st_mode)) {
            if (nl == NULL) 
                nl = _cmime_internal_determine_linebreak_from_file(filename);
            
            mi = cmime_util_info_get_from_file(filename);
            if (strcmp(mi->mime_encoding,"binary")==0) 
                asprintf(&ptemp,"%s;%s\tname=%s%s",mi->mime_type,nl,basename(filename),nl);
            else 
                asprintf(&ptemp,"%s;%s\tcharset=%s%s",mi->mime_type,nl,mi->mime_encoding,nl);
            
            cmime_util_info_free(mi);
            cmime_part_set_content_type((*part),ptemp);
            encode = (strncmp(ptemp,MIMETYPE_TEXT_PLAIN,strlen(MIMETYPE_TEXT_PLAIN)) == 0) ? 0 : 1;
            
                    
            if (encode == 1) {
                free(ptemp);
                asprintf(&ptemp,"base64%s",nl);
            } else {
                if (strstr(ptemp,"ascii")!=NULL) {
                    free(ptemp);
                    asprintf(&ptemp,"7bit%s",nl);
                } else {
                    free(ptemp);
                    asprintf(&ptemp,"8bit%s",nl);
                }
            }

            cmime_part_set_content_transfer_encoding((*part),ptemp);
            free(ptemp);
            
            asprintf(&ptemp,"attachment;%s\tfilename=%s%s",nl,basename(filename),nl);
            cmime_part_set_content_disposition((*part),ptemp);      
            free(ptemp);
            
            fp = fopen(filename, "rb");
            if (fp != NULL) {
                (*part)->content = (char *)calloc(1,sizeof(char));
                while(!feof(fp)) {
                    len = 0;
                    
                    for(i=0; i<3; i++) {
                        in[i] = (unsigned char)fgetc(fp);

                        if(!feof(fp)) {
                            len++;
                        } else {
                            in[i] = 0;
                        }
                    }

                    if (len) {
                        if (encode == 0) {
                            (*part)->content = (char *)realloc((*part)->content,strlen((*part)->content) + sizeof(in) + sizeof(char) +1);
                            for(i=0; i<3; i++) {
                                (*part)->content[pos++] = in[i];    
                            }
                            (*part)->content[pos] = '\0';
                        } else {
                            cmime_base64_encode_block(in,out,len);
                            (*part)->content = (char *)realloc((*part)->content,strlen((*part)->content) + sizeof(out) + sizeof(char) + 1);
                            for (i=0; i<4;i++) {
                                (*part)->content[pos++] = out[i];
                            }
                            (*part)->content[pos] = '\0';                       
                        }
                        blocksout++;
                    }

                    if(blocksout >= (LINE_LENGTH / 4) || feof(fp)) {
                        if(blocksout && (encode == 1)) {
                            /* if base64 data, we need to do a line break after LINE_LENGTH chars */
                            (*part)->content = (char *)realloc((*part)->content,strlen((*part)->content) + strlen(nl) + sizeof(char));
                            
                            for (i=0; i<strlen(nl);i++) {
                                (*part)->content[pos++] = nl[i];    
                            }
                            (*part)->content[pos] = '\0';
                        }
                    blocksout = 0;
                    } 
                }
                if (fclose(fp)!=0)
                    perror("libcmime: error closing file");
            } else {
                perror("libcmime: error opening file");
                return (-3); /* failed to open file */
            }           
        } else {
            return(-2); /* not regular file */
        } 
    } else {
        return(-1); /* stat error */
    }
    
    return(0);
}